

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

ProfiledInstr * IR::ProfiledInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  JitArenaAllocator *pJVar1;
  ProfiledInstr *this;
  TrackAllocData local_58;
  ProfiledInstr *local_30;
  ProfiledInstr *profiledInstr;
  Func *func_local;
  Opnd *src1Opnd_local;
  Opnd *dstOpnd_local;
  OpCode opcode_local;
  
  pJVar1 = func->m_alloc;
  profiledInstr = (ProfiledInstr *)func;
  func_local = (Func *)src1Opnd;
  src1Opnd_local = dstOpnd;
  dstOpnd_local._6_2_ = opcode;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x353);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_58);
  this = (ProfiledInstr *)new<Memory::JitArenaAllocator>(0x60,pJVar1,0x4e98c0);
  ProfiledInstr(this,false);
  local_30 = this;
  Instr::Init((Instr *)this,dstOpnd_local._6_2_,InstrKindProfiled,(Func *)profiledInstr);
  if (src1Opnd_local != (Opnd *)0x0) {
    Instr::SetDst(&local_30->super_Instr,src1Opnd_local);
  }
  if (func_local != (Func *)0x0) {
    Instr::SetSrc1(&local_30->super_Instr,(Opnd *)func_local);
  }
  (local_30->u).ldElemInfo = (LdElemInfo *)0x0;
  return local_30;
}

Assistant:

ProfiledInstr *
ProfiledInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    ProfiledInstr * profiledInstr = JitAnew(func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(opcode, InstrKindProfiled, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

    profiledInstr->u.ldElemInfo = nullptr;
    return profiledInstr;
}